

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O3

void __thiscall Memory::LargeHeapBucket::Sweep(LargeHeapBucket *this,RecyclerSweep *recyclerSweep)

{
  LargeHeapBlock *heapBlockList;
  LargeHeapBlock *heapBlockList_00;
  LargeHeapBlock *heapBlockList_01;
  LargeHeapBlock *heapBlockList_02;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Recycler *pRVar4;
  undefined4 *puVar5;
  
  pRVar4 = RecyclerSweep::GetRecycler(recyclerSweep);
  BVar3 = Recycler::IsConcurrentExecutingState(pRVar4);
  if (BVar3 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x251,"(!recyclerSweep.GetRecycler()->IsConcurrentExecutingState())",
                       "!recyclerSweep.GetRecycler()->IsConcurrentExecutingState()");
    if (!bVar2) goto LAB_006ef51e;
    *puVar5 = 0;
  }
  heapBlockList = this->fullLargeBlockList;
  heapBlockList_00 = this->largeBlockList;
  heapBlockList_01 = this->largePageHeapBlockList;
  heapBlockList_02 = this->pendingDisposeLargeBlockList;
  this->fullLargeBlockList = (LargeHeapBlock *)0x0;
  this->largeBlockList = (LargeHeapBlock *)0x0;
  this->largePageHeapBlockList = (LargeHeapBlock *)0x0;
  if (this->supportFreeList == true) {
    pRVar4 = RecyclerSweep::GetRecycler(recyclerSweep);
    if (pRVar4->recyclerFlagsTable->Verbose == true) {
      pRVar4 = RecyclerSweep::GetRecycler(recyclerSweep);
      bVar2 = Js::Phases::IsEnabled(&pRVar4->recyclerFlagsTable->Trace,MemoryAllocationPhase);
      if (!bVar2) {
        pRVar4 = RecyclerSweep::GetRecycler(recyclerSweep);
        bVar2 = Js::Phases::IsEnabled(&pRVar4->recyclerFlagsTable->Trace,LargeMemoryAllocationPhase)
        ;
        if (!bVar2) goto LAB_006ef475;
      }
      Output::Print(L"Resetting free list for 0x%x bucket\n",(ulong)(this->super_HeapBucket).sizeCat
                   );
    }
LAB_006ef475:
    this->freeList = (LargeHeapBlockFreeList *)0x0;
    this->explicitFreeList = (FreeObject *)0x0;
  }
  if (this->pendingSweepLargeBlockList != (LargeHeapBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x26d,"(this->pendingSweepLargeBlockList == nullptr)",
                       "this->pendingSweepLargeBlockList == nullptr");
    if (!bVar2) {
LAB_006ef51e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  SweepLargeHeapBlockList(this,recyclerSweep,heapBlockList_00);
  SweepLargeHeapBlockList(this,recyclerSweep,heapBlockList_01);
  SweepLargeHeapBlockList(this,recyclerSweep,heapBlockList);
  SweepLargeHeapBlockList(this,recyclerSweep,heapBlockList_02);
  return;
}

Assistant:

void
LargeHeapBucket::Sweep(RecyclerSweep& recyclerSweep)
{
#if ENABLE_CONCURRENT_GC
    // CONCURRENT-TODO: large buckets are not swept in the background currently.
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    Assert(!recyclerSweep.GetRecycler()->IsConcurrentExecutingState() && !recyclerSweep.GetRecycler()->IsConcurrentSweepState());
#else
    Assert(!recyclerSweep.GetRecycler()->IsConcurrentExecutingState());
#endif
#endif

    LargeHeapBlock * currentLargeObjectBlocks = largeBlockList;
#ifdef RECYCLER_PAGE_HEAP
    LargeHeapBlock * currentLargePageHeapObjectBlocks = largePageHeapBlockList;
#endif
    LargeHeapBlock * currentFullLargeObjectBlocks = fullLargeBlockList;
    LargeHeapBlock * currentDisposeLargeBlockList = pendingDisposeLargeBlockList;
    this->largeBlockList = nullptr;
#ifdef RECYCLER_PAGE_HEAP
    this->largePageHeapBlockList = nullptr;
#endif
    this->fullLargeBlockList = nullptr;

    // Clear the free list before sweep
    // We'll reconstruct the free list during sweep
    if (this->supportFreeList)
    {
#if DBG
        LargeAllocationVerboseTrace(recyclerSweep.GetRecycler()->GetRecyclerFlagsTable(), _u("Resetting free list for 0x%x bucket\n"), this->sizeCat);
#endif
        this->freeList = nullptr;
        this->explicitFreeList = nullptr;
    }

#if ENABLE_CONCURRENT_GC
    Assert(this->pendingSweepLargeBlockList == nullptr);
#endif
    SweepLargeHeapBlockList(recyclerSweep, currentLargeObjectBlocks);
#ifdef RECYCLER_PAGE_HEAP
    SweepLargeHeapBlockList(recyclerSweep, currentLargePageHeapObjectBlocks);
#endif
    SweepLargeHeapBlockList(recyclerSweep, currentFullLargeObjectBlocks);
    SweepLargeHeapBlockList(recyclerSweep, currentDisposeLargeBlockList);
}